

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationCase::iterate(BlendEquationCase *this)

{
  GLenum *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLenum *pGVar3;
  int *piVar4;
  TestLog *pTVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  GLenum err;
  undefined4 extraout_var;
  undefined *puVar17;
  GLuint GVar18;
  undefined4 *puVar19;
  ulong uVar20;
  ulong uVar21;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  GLint local_e4;
  ScopedLogSection local_e0;
  string local_d8;
  string local_b8;
  CallLogWrapper local_98;
  ResultCollector local_80;
  
  iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_98,(Functions *)CONCAT44(extraout_var,iVar16),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar5,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_e4 = 0;
  local_98.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_98,0x8824,&local_e4);
  err = glu::CallLogWrapper::glGetError(&local_98);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x4de);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Initial","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    iVar16 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar16,0x8006,this->m_verifierType);
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_e4);
    if (0 < local_e4) {
      iVar16 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x883d,iVar16,0x8006,this->m_verifierType);
        iVar16 = iVar16 + 1;
      } while (iVar16 < local_e4);
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingCommon","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendEquation(&local_98,0x800a);
  if (0 < local_e4) {
    iVar16 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar16,0x800a,this->m_verifierType);
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_e4);
    if (0 < local_e4) {
      iVar16 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x883d,iVar16,0x800a,this->m_verifierType);
        iVar16 = iVar16 + 1;
      } while (iVar16 < local_e4);
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterSettingCommonSeparate","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After setting common separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendEquationSeparate(&local_98,0x800b,0x800a);
  if (0 < local_e4) {
    iVar16 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar16,0x800b,this->m_verifierType);
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_e4);
    if (0 < local_e4) {
      iVar16 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x883d,iVar16,0x800a,this->m_verifierType);
        iVar16 = iVar16 + 1;
      } while (iVar16 < local_e4);
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingIndexed","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting indexed","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    puVar19 = &DAT_00976f90;
    uVar20 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar20;
      glu::CallLogWrapper::glBlendEquationi
                (&local_98,(GLuint)uVar20,
                 *(GLenum *)
                  ((long)puVar19 +
                  (SUB168(auVar6 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5));
      uVar20 = uVar20 + 1;
      puVar19 = puVar19 + 1;
    } while ((int)uVar20 < local_e4);
    if (0 < local_e4) {
      puVar19 = &DAT_00976f90;
      uVar20 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar20;
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x8009,(int)uVar20,
                   *(int *)((long)puVar19 +
                           (SUB168(auVar7 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) *
                           -5),this->m_verifierType);
        uVar20 = uVar20 + 1;
        puVar19 = puVar19 + 1;
      } while ((int)uVar20 < local_e4);
      if (0 < local_e4) {
        puVar19 = &DAT_00976f90;
        uVar20 = 0;
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar20;
          gls::StateQueryUtil::verifyStateIndexedInteger
                    (&local_80,&local_98,0x883d,(int)uVar20,
                     *(int *)((long)puVar19 +
                             (SUB168(auVar8 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) *
                             -5),this->m_verifierType);
          uVar20 = uVar20 + 1;
          puVar19 = puVar19 + 1;
        } while ((int)uVar20 < local_e4);
      }
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterSettingIndexedSeparate","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After setting indexed separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar19 = &DAT_00976f90;
  puVar17 = &DAT_00976f94;
  uVar21 = 1;
  uVar20 = 0;
  while( true ) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar20;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar21;
    GVar18 = (GLuint)uVar20;
    if (local_e4 <= (int)GVar18) break;
    pGVar1 = (GLenum *)
             ((long)puVar19 +
             (SUB168(auVar9 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    uVar20 = uVar20 + 1;
    pGVar3 = (GLenum *)
             (puVar17 + (SUB168(auVar10 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5)
    ;
    puVar19 = puVar19 + 1;
    puVar17 = puVar17 + 4;
    uVar21 = uVar21 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&local_98,GVar18,*pGVar1,*pGVar3);
  }
  if (0 < local_e4) {
    puVar19 = &DAT_00976f90;
    uVar20 = 0;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar20;
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,(int)uVar20,
                 *(int *)((long)puVar19 +
                         (SUB168(auVar11 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5
                         ),this->m_verifierType);
      uVar20 = uVar20 + 1;
      puVar19 = puVar19 + 1;
    } while ((int)uVar20 < local_e4);
  }
  puVar17 = &DAT_00976f94;
  uVar20 = 1;
  for (iVar16 = 0; auVar12._8_8_ = 0, auVar12._0_8_ = uVar20, iVar16 < local_e4; iVar16 = iVar16 + 1
      ) {
    piVar4 = (int *)(puVar17 +
                    (SUB168(auVar12 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    puVar17 = puVar17 + 4;
    uVar20 = uVar20 + 1;
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&local_80,&local_98,0x883d,iVar16,*piVar4,this->m_verifierType);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommon","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After resetting indexed with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    puVar19 = &DAT_00976f90;
    uVar20 = 0;
    do {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar20;
      glu::CallLogWrapper::glBlendEquationi
                (&local_98,(GLuint)uVar20,
                 *(GLenum *)
                  ((long)puVar19 +
                  (SUB168(auVar13 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5));
      uVar20 = uVar20 + 1;
      puVar19 = puVar19 + 1;
    } while ((int)uVar20 < local_e4);
  }
  glu::CallLogWrapper::glBlendEquation(&local_98,0x800a);
  if (0 < local_e4) {
    iVar16 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar16,0x800a,this->m_verifierType);
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_e4);
    if (0 < local_e4) {
      iVar16 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x883d,iVar16,0x800a,this->m_verifierType);
        iVar16 = iVar16 + 1;
      } while (iVar16 < local_e4);
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommonSeparate","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After resetting indexed with common separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar19 = &DAT_00976f90;
  puVar17 = &DAT_00976f94;
  uVar21 = 1;
  uVar20 = 0;
  while( true ) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar20;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar21;
    GVar18 = (GLuint)uVar20;
    if (local_e4 <= (int)GVar18) break;
    pGVar1 = (GLenum *)
             ((long)puVar19 +
             (SUB168(auVar14 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    uVar20 = uVar20 + 1;
    pGVar3 = (GLenum *)
             (puVar17 + (SUB168(auVar15 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5)
    ;
    puVar19 = puVar19 + 1;
    puVar17 = puVar17 + 4;
    uVar21 = uVar21 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&local_98,GVar18,*pGVar1,*pGVar3);
  }
  glu::CallLogWrapper::glBlendEquationSeparate(&local_98,0x800b,0x800a);
  if (0 < local_e4) {
    iVar16 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar16,0x800b,this->m_verifierType);
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_e4);
    if (0 < local_e4) {
      iVar16 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_98,0x883d,iVar16,0x800a,this->m_verifierType);
        iVar16 = iVar16 + 1;
      } while (iVar16 < local_e4);
    }
  }
  tcu::TestLog::endSection(local_e0.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_98);
  return STOP;
}

Assistant:

BlendEquationCase::IterateResult BlendEquationCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_ADD, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_ADD, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}